

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

Image<eos::core::Pixel<unsigned_char,_4>_> * __thiscall
eos::core::image::constant<eos::core::Pixel<unsigned_char,4>>
          (Image<eos::core::Pixel<unsigned_char,_4>_> *__return_storage_ptr__,image *this,int height
          ,int width,Pixel<unsigned_char,_4> value)

{
  Pixel<unsigned_char,_4> *pPVar1;
  int height_00;
  int y;
  int x;
  
  height_00 = (int)this;
  Image<eos::core::Pixel<unsigned_char,_4>_>::Image(__return_storage_ptr__,height_00,height);
  if (0 < height_00) {
    y = 0;
    do {
      if (0 < height) {
        x = 0;
        do {
          pPVar1 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                             (__return_storage_ptr__,y,x);
          *(int *)(pPVar1->data_)._M_elems = width;
          x = x + 1;
        } while (height != x);
      }
      y = y + 1;
    } while (y != height_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Image<PixelType> constant(int height, int width, PixelType value) noexcept
{
    Image<PixelType> image(height, width);
    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {
            image(y, x) = value;
        }
    }
    return image;
}